

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  bool bVar1;
  mapped_type *this_00;
  reference pDVar2;
  iterator iStack_40;
  Decoration d;
  iterator __end1;
  iterator __begin1;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> *__range1;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> *decoVec;
  Decoration decor_local;
  Id id_local;
  TGlslangToSpvTraverser *this_local;
  
  decoVec._0_4_ = decor;
  decoVec._4_4_ = id;
  _decor_local = this;
  this_00 = std::
            unordered_map<unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>_>
            ::operator[](&this->idToQCOMDecorations,(key_type *)((long)&decoVec + 4));
  __end1 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::begin(this_00);
  iStack_40 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0);
    if (!bVar1) {
      return false;
    }
    pDVar2 = __gnu_cxx::
             __normal_iterator<spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
             ::operator*(&__end1);
    if (*pDVar2 == (Decoration)decoVec) break;
    __gnu_cxx::
    __normal_iterator<spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration(spv::Id id, spv::Decoration decor)
{
  std::vector<spv::Decoration> &decoVec = idToQCOMDecorations[id];
  for ( auto d : decoVec ) {
    if ( d == decor )
      return true;
  }
  return false;
}